

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

int __thiscall lzham::lzcompressor::init(lzcompressor *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  uint uVar5;
  uint i;
  uint match_accel_helper_threads;
  int num_parse_jobs;
  uint max_block_size;
  uint dict_size;
  uint in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb4;
  uint local_40;
  bool local_39;
  lzcompressor *ctx_00;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined1 local_1;
  
  clear(this);
  if ((*(uint *)(ctx + 0x10) < 0xf) || (0x1d < *(uint *)(ctx + 0x10))) {
    local_1 = 0;
    this = (lzcompressor *)ctx;
  }
  else if ((*(int *)(ctx + 0xc) < 0) || (5 < *(int *)(ctx + 0xc))) {
    local_1 = 0;
    this = (lzcompressor *)ctx;
  }
  else {
    memcpy(&this->m_params,ctx,0x24);
    local_39 = false;
    if ((this->m_params).m_pTask_pool != (task_pool *)0x0) {
      uVar3 = task_pool::get_num_threads((this->m_params).m_pTask_pool);
      local_39 = false;
      if (uVar3 != 0) {
        local_39 = (this->m_params).m_max_helper_threads != 0;
      }
    }
    this->m_use_task_pool = local_39;
    if (((this->m_params).m_max_helper_threads == 0) || ((this->m_use_task_pool & 1U) != 0)) {
      uVar5 = *(uint *)(ctx + 0xc);
      uVar1 = *(undefined8 *)(s_settings + (ulong)uVar5 * 0x10);
      (this->m_settings).m_fast_bytes = (int)uVar1;
      (this->m_settings).m_fast_adaptive_huffman_updating = (bool)(char)((ulong)uVar1 >> 0x20);
      (this->m_settings).m_use_polar_codes = (bool)(char)((ulong)uVar1 >> 0x28);
      *(short *)&(this->m_settings).field_0x6 = (short)((ulong)uVar1 >> 0x30);
      uVar1 = *(undefined8 *)(s_settings + (ulong)uVar5 * 0x10 + 8);
      (this->m_settings).m_match_accel_max_matches_per_probe = (int)uVar1;
      (this->m_settings).m_match_accel_max_probes = (int)((ulong)uVar1 >> 0x20);
      if (((this->m_params).m_lzham_compress_flags & 1) != 0) {
        (this->m_settings).m_use_polar_codes = true;
      }
      uVar5 = (uint)(1 << ((byte)(this->m_params).m_dict_size_log2 & 0x1f)) >> 3;
      if (uVar5 < (this->m_params).m_block_size) {
        (this->m_params).m_block_size = uVar5;
      }
      this->m_num_parse_threads = 1;
      if (*(int *)(ctx + 8) != 0) {
        if ((this->m_params).m_block_size < 0x4000) {
          if (*(int *)(ctx + 8) + 1U < 9) {
            local_40 = *(int *)(ctx + 8) + 1;
          }
          else {
            local_40 = 8;
          }
          this->m_num_parse_threads = local_40;
        }
        else if ((*(int *)(ctx + 8) == 1) ||
                ((this->m_params).m_compression_level == cCompressionLevelFastest)) {
          this->m_num_parse_threads = 1;
        }
        else if (*(uint *)(ctx + 8) < 4) {
          this->m_num_parse_threads = 2;
        }
        else if (*(uint *)(ctx + 8) < 8) {
          if ((((this->m_params).m_lzham_compress_flags & 2) == 0) ||
             ((this->m_params).m_compression_level != cCompressionLevelUber)) {
            this->m_num_parse_threads = 2;
          }
          else {
            this->m_num_parse_threads = 4;
          }
        }
        else {
          this->m_num_parse_threads = 4;
        }
      }
      uVar3 = (this->m_settings).m_match_accel_max_probes;
      ctx_00 = this;
      uVar5 = search_accelerator::init(&this->m_accel,(EVP_PKEY_CTX *)this);
      this = (lzcompressor *)(ulong)uVar5;
      if ((uVar5 & 1) == 0) {
        local_1 = 0;
      }
      else {
        CLZDecompBase::init_position_slots
                  ((CLZDecompBase *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (uint)((ulong)ctx_00 >> 0x20));
        CLZBase::init_slot_tabs
                  ((CLZBase *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        uVar5 = state::init(&ctx_00->m_state,(EVP_PKEY_CTX *)ctx_00);
        this = (lzcompressor *)(ulong)uVar5;
        if ((uVar5 & 1) == 0) {
          local_1 = 0;
        }
        else {
          bVar2 = vector<unsigned_char>::try_reserve
                            ((vector<unsigned_char> *)CONCAT44(in_stack_ffffffffffffffb4,uVar3),
                             in_stack_ffffffffffffffac);
          this = (lzcompressor *)CONCAT71(extraout_var,bVar2);
          if (bVar2) {
            bVar2 = vector<unsigned_char>::try_reserve
                              ((vector<unsigned_char> *)CONCAT44(in_stack_ffffffffffffffb4,uVar3),
                               in_stack_ffffffffffffffac);
            this = (lzcompressor *)CONCAT71(extraout_var_00,bVar2);
            if (bVar2) {
              for (uVar5 = 0; this = (lzcompressor *)(ulong)uVar5,
                  uVar5 < ctx_00->m_num_parse_threads; uVar5 = uVar5 + 1) {
                uVar4 = state::init(&ctx_00->m_parse_thread_state[uVar5].
                                     super_raw_parse_thread_state.m_approx_state,
                                    (EVP_PKEY_CTX *)ctx_00);
                this = (lzcompressor *)(ulong)uVar4;
                if ((uVar4 & 1) == 0) {
                  local_1 = 0;
                  goto LAB_00114c06;
                }
              }
              local_1 = 1;
            }
            else {
              local_1 = 0;
            }
          }
          else {
            local_1 = 0;
          }
        }
      }
    }
    else {
      local_1 = 0;
    }
  }
LAB_00114c06:
  return (int)CONCAT71((int7)((ulong)this >> 8),local_1);
}

Assistant:

bool lzcompressor::init(const init_params& params)
   {
      clear();

      if ((params.m_dict_size_log2 < CLZBase::cMinDictSizeLog2) || (params.m_dict_size_log2 > CLZBase::cMaxDictSizeLog2))
         return false;
      if ((params.m_compression_level < 0) || (params.m_compression_level > cCompressionLevelCount))
         return false;

      m_params = params;
      m_use_task_pool = (m_params.m_pTask_pool) && (m_params.m_pTask_pool->get_num_threads() != 0) && (m_params.m_max_helper_threads > 0);
      if ((m_params.m_max_helper_threads) && (!m_use_task_pool))
         return false;
      m_settings = s_settings[params.m_compression_level];

      if (m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_FORCE_POLAR_CODING)
         m_settings.m_use_polar_codes = true;

      const uint dict_size = 1U << m_params.m_dict_size_log2;

      uint max_block_size = dict_size / 8;
      if (m_params.m_block_size > max_block_size)
      {
         m_params.m_block_size = max_block_size;
      }

      m_num_parse_threads = 1;

#if !LZHAM_FORCE_SINGLE_THREADED_PARSING
      if (params.m_max_helper_threads > 0)
      {
         LZHAM_ASSUME(cMaxParseThreads >= 4);

         if (m_params.m_block_size < 16384)
         {
            m_num_parse_threads = LZHAM_MIN(cMaxParseThreads, params.m_max_helper_threads + 1);
         }
         else
         {
            if ((params.m_max_helper_threads == 1) || (m_params.m_compression_level == cCompressionLevelFastest))
            {
               m_num_parse_threads = 1;
            }
            else if (params.m_max_helper_threads <= 3)
            {
               m_num_parse_threads = 2;
            }
            else if (params.m_max_helper_threads <= 7)
            {
               if ((m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_EXTREME_PARSING) && (m_params.m_compression_level == cCompressionLevelUber))
                  m_num_parse_threads = 4;
               else
                  m_num_parse_threads = 2;
            }
            else
            {
               // 8-16
               m_num_parse_threads = 4;
            }
         }
      }
#endif

      int num_parse_jobs = m_num_parse_threads - 1;
      uint match_accel_helper_threads = LZHAM_MAX(0, (int)params.m_max_helper_threads - num_parse_jobs);

      LZHAM_ASSERT(m_num_parse_threads >= 1);
      LZHAM_ASSERT(m_num_parse_threads <= cMaxParseThreads);

      if (!m_use_task_pool)
      {
         LZHAM_ASSERT(!match_accel_helper_threads && (m_num_parse_threads == 1));
      }
      else
      {
         LZHAM_ASSERT((match_accel_helper_threads + (m_num_parse_threads - 1)) <= params.m_max_helper_threads);
      }

      if (!m_accel.init(this, params.m_pTask_pool, match_accel_helper_threads, dict_size, m_settings.m_match_accel_max_matches_per_probe, false, m_settings.m_match_accel_max_probes))
         return false;

      init_position_slots(params.m_dict_size_log2);
      init_slot_tabs();

      if (!m_state.init(*this, m_settings.m_fast_adaptive_huffman_updating, m_settings.m_use_polar_codes))
         return false;

      if (!m_block_buf.try_reserve(m_params.m_block_size))
         return false;

      if (!m_comp_buf.try_reserve(m_params.m_block_size*2))
         return false;

      for (uint i = 0; i < m_num_parse_threads; i++)
      {
         if (!m_parse_thread_state[i].m_approx_state.init(*this, m_settings.m_fast_adaptive_huffman_updating, m_settings.m_use_polar_codes))
            return false;
      }

      return true;
   }